

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

void __thiscall OPL_DOSBOXdump::~OPL_DOSBOXdump(OPL_DOSBOXdump *this)

{
  int local_20;
  int local_1c;
  DWORD len [2];
  long where_am_i;
  OPL_DOSBOXdump *this_local;
  
  (this->super_OPLDump).super_OPLEmul._vptr_OPLEmul = (_func_int **)&PTR__OPL_DOSBOXdump_009efa00;
  if ((this->super_OPLDump).File != (FILE *)0x0) {
    len = (DWORD  [2])ftell((FILE *)(this->super_OPLDump).File);
    fseek((FILE *)(this->super_OPLDump).File,0xc,0);
    local_20 = (this->super_OPLDump).CurIntTime;
    local_1c = len[0] - 0x18;
    fwrite(&local_20,4,2,(FILE *)(this->super_OPLDump).File);
    fclose((FILE *)(this->super_OPLDump).File);
  }
  OPLDump::~OPLDump(&this->super_OPLDump);
  return;
}

Assistant:

virtual ~OPL_DOSBOXdump()
	{
		if (File != NULL)
		{
			long where_am_i = ftell(File);
			DWORD len[2];

			fseek(File, 12, SEEK_SET);
			len[0] = LittleLong(CurIntTime);
			len[1] = LittleLong(DWORD(where_am_i - 24));
			fwrite(len, 4, 2, File);
			fclose(File);
		}
	}